

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O2

SQOpcode __thiscall SQCompiler::ChooseArithOpByToken(SQCompiler *this,SQInteger tok)

{
  SQOpcode SVar1;
  
  if (tok == 0x25) {
LAB_0011da8a:
    SVar1 = _OP_MOD;
  }
  else {
    if (tok == 0x2a) {
      return _OP_MUL;
    }
    if (tok == 0x2d) {
      return _OP_SUB;
    }
    if (tok != 0x2f) {
      if (tok == 0x13f) goto LAB_0011da8a;
      if (tok == 0x13d) {
        return _OP_MUL;
      }
      if (tok != 0x13e) {
        if (tok == 0x122) {
          return _OP_SUB;
        }
        return _OP_ADD;
      }
    }
    SVar1 = _OP_DIV;
  }
  return SVar1;
}

Assistant:

SQOpcode ChooseArithOpByToken(SQInteger tok)
    {
        switch(tok) {
            case TK_PLUSEQ: case '+': return _OP_ADD;
            case TK_MINUSEQ: case '-': return _OP_SUB;
            case TK_MULEQ: case '*': return _OP_MUL;
            case TK_DIVEQ: case '/': return _OP_DIV;
            case TK_MODEQ: case '%': return _OP_MOD;
            default: assert(0);
        }
        return _OP_ADD;
    }